

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_simple_mcc_decorrelation_data_t *poVar1;
  long lVar2;
  opj_mct_data_t *poVar3;
  OPJ_BYTE *pOVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  OPJ_BOOL OVar8;
  opj_tcp_t *poVar9;
  opj_mct_data_t *poVar10;
  uint uVar11;
  uint uVar12;
  OPJ_UINT32 l_tmp;
  OPJ_BYTE *local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x15df,
                  "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x15e0,
                  "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar9 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar9 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_00116277:
    pcVar6 = "Error reading MCT marker\n";
LAB_0011627e:
    OVar8 = 0;
    opj_event_msg(p_manager,1,pcVar6);
  }
  else {
    opj_read_bytes_LE(p_header_data,&l_tmp,2);
    if (l_tmp == 0) {
      if (p_header_size < 7) goto LAB_00116277;
      opj_read_bytes_LE(p_header_data + 2,&l_tmp,2);
      pOVar4 = p_header_data + 4;
      poVar10 = poVar9->m_mct_records;
      uVar12 = poVar9->m_nb_mct_records;
      poVar3 = poVar10;
      uVar5 = uVar12;
      while( true ) {
        uVar11 = l_tmp & 0xff;
        if (uVar5 == 0) break;
        if (poVar3->m_index == uVar11) {
          if (uVar5 != 0) goto LAB_001163fc;
          break;
        }
        poVar3 = poVar3 + 1;
        uVar5 = uVar5 - 1;
      }
      if (uVar12 == poVar9->m_nb_max_mct_records) {
        poVar9->m_nb_max_mct_records = uVar12 + 10;
        local_38 = pOVar4;
        poVar3 = (opj_mct_data_t *)opj_realloc(poVar10,(ulong)(uVar12 + 10) << 5);
        poVar10 = poVar9->m_mct_records;
        if (poVar3 != (opj_mct_data_t *)0x0) {
          if (poVar3 != poVar10) {
            uVar12 = poVar9->m_nb_mcc_records;
            for (lVar7 = 0; (ulong)uVar12 << 5 != lVar7; lVar7 = lVar7 + 0x20) {
              poVar1 = poVar9->m_mcc_records;
              lVar2 = *(long *)((long)&poVar1->m_decorrelation_array + lVar7);
              if (lVar2 != 0) {
                *(long *)((long)&poVar1->m_decorrelation_array + lVar7) =
                     (lVar2 - (long)poVar10) + (long)poVar3;
              }
              lVar2 = *(long *)((long)&poVar1->m_offset_array + lVar7);
              if (lVar2 != 0) {
                *(long *)((long)&poVar1->m_offset_array + lVar7) =
                     (lVar2 - (long)poVar10) + (long)poVar3;
              }
            }
          }
          poVar9->m_mct_records = poVar3;
          memset(poVar3 + poVar9->m_nb_mct_records,0,
                 (ulong)(poVar9->m_nb_max_mct_records - poVar9->m_nb_mct_records) << 5);
          poVar10 = poVar9->m_mct_records;
          uVar12 = poVar9->m_nb_mct_records;
          pOVar4 = local_38;
          goto LAB_001163ea;
        }
        opj_free(poVar10);
        poVar9->m_mct_records = (opj_mct_data_t *)0x0;
        poVar9->m_nb_mct_records = 0;
        poVar9->m_nb_max_mct_records = 0;
        pcVar6 = "Not enough memory to read MCT marker\n";
        goto LAB_0011627e;
      }
LAB_001163ea:
      poVar3 = poVar10 + uVar12;
      poVar9->m_nb_mct_records = uVar12 + 1;
LAB_001163fc:
      if (poVar3->m_data != (OPJ_BYTE *)0x0) {
        opj_free(poVar3->m_data);
        poVar3->m_data = (OPJ_BYTE *)0x0;
        poVar3->m_data_size = 0;
      }
      poVar3->m_index = uVar11;
      poVar3->m_array_type = l_tmp >> 8 & (MCT_TYPE_OFFSET|MCT_TYPE_DECORRELATION);
      poVar3->m_element_type = l_tmp >> 10 & MCT_TYPE_DOUBLE;
      opj_read_bytes_LE(pOVar4,&l_tmp,2);
      if (l_tmp != 0) {
        pcVar6 = "Cannot take in charge multiple MCT markers\n";
        goto LAB_001162b0;
      }
      uVar12 = p_header_size - 6;
      pOVar4 = (OPJ_BYTE *)opj_malloc((ulong)uVar12);
      poVar3->m_data = pOVar4;
      if (pOVar4 == (OPJ_BYTE *)0x0) goto LAB_00116277;
      memcpy(pOVar4,p_header_data + 6,(ulong)uVar12);
      poVar3->m_data_size = uVar12;
    }
    else {
      pcVar6 = "Cannot take in charge mct data within multiple MCT records\n";
LAB_001162b0:
      opj_event_msg(p_manager,2,pcVar6);
    }
    OVar8 = 1;
  }
  return OVar8;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 i;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_tmp;
    OPJ_UINT32 l_indix;
    opj_mct_data_t * l_mct_data;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);

    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* first marker */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Zmct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge mct data within multiple MCT records\n");
        return OPJ_TRUE;
    }

    if (p_header_size <= 6) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Imct */
    p_header_data += 2;

    l_indix = l_tmp & 0xff;
    l_mct_data = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {
        if (l_mct_data->m_index == l_indix) {
            break;
        }
        ++l_mct_data;
    }

    /* NOT FOUND */
    if (i == l_tcp->m_nb_mct_records) {
        if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
            opj_mct_data_t *new_mct_records;
            l_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;

            new_mct_records = (opj_mct_data_t *) opj_realloc(l_tcp->m_mct_records,
                              l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
            if (! new_mct_records) {
                opj_free(l_tcp->m_mct_records);
                l_tcp->m_mct_records = NULL;
                l_tcp->m_nb_max_mct_records = 0;
                l_tcp->m_nb_mct_records = 0;
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCT marker\n");
                return OPJ_FALSE;
            }

            /* Update m_mcc_records[].m_offset_array and m_decorrelation_array
             * to point to the new addresses */
            if (new_mct_records != l_tcp->m_mct_records) {
                for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {
                    opj_simple_mcc_decorrelation_data_t* l_mcc_record =
                        &(l_tcp->m_mcc_records[i]);
                    if (l_mcc_record->m_decorrelation_array) {
                        l_mcc_record->m_decorrelation_array =
                            new_mct_records +
                            (l_mcc_record->m_decorrelation_array -
                             l_tcp->m_mct_records);
                    }
                    if (l_mcc_record->m_offset_array) {
                        l_mcc_record->m_offset_array =
                            new_mct_records +
                            (l_mcc_record->m_offset_array -
                             l_tcp->m_mct_records);
                    }
                }
            }

            l_tcp->m_mct_records = new_mct_records;
            l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
            memset(l_mct_data, 0, (l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) *
                   sizeof(opj_mct_data_t));
        }

        l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
        ++l_tcp->m_nb_mct_records;
    }

    if (l_mct_data->m_data) {
        opj_free(l_mct_data->m_data);
        l_mct_data->m_data = 00;
        l_mct_data->m_data_size = 0;
    }

    l_mct_data->m_index = l_indix;
    l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
    l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Ymct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple MCT markers\n");
        return OPJ_TRUE;
    }

    p_header_size -= 6;

    l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
    if (! l_mct_data->m_data) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }
    memcpy(l_mct_data->m_data, p_header_data, p_header_size);

    l_mct_data->m_data_size = p_header_size;

    return OPJ_TRUE;
}